

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void add2C(int v)

{
  _WordT *p_Var1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  uVar7 = (ulong)v;
  std::bitset<15000UL>::reset(&P,uVar7);
  sizeP = sizeP + -1;
  iVar6 = CE_P_[uVar7];
  if (iVar6 < 1) {
    if (14999 < (uint)v) goto LAB_001178f1;
    p_Var1 = Cm.super__Base_bitset<235UL>._M_w + (uVar7 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
    piVar3 = NAdjB;
    CE_Cm_Cm = CE_Cm_Cm + CE_Cm_[uVar7];
    CE_Cm_Cp = CE_Cm_Cp + CE_Cp_[uVar7];
    iVar4 = NAdjP[uVar7];
    iVar8 = NAdjP[(ulong)(uint)v + 1];
    if (iVar4 < iVar8) {
      lVar9 = (long)iVar4;
      do {
        CE_Cm_[piVar3[lVar9]] = CE_Cm_[piVar3[lVar9]] + 1;
        lVar9 = lVar9 + 1;
      } while (iVar8 != lVar9);
    }
  }
  else {
    if (14999 < (uint)v) {
LAB_001178f1:
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar7,15000);
    }
    p_Var1 = Cp.super__Base_bitset<235UL>._M_w + (uVar7 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
    piVar3 = NAdjB;
    CE_Cp_Cp = CE_Cp_Cp + CE_Cp_[uVar7];
    CE_Cp_P = CE_Cp_P + iVar6;
    CE_Cm_Cp = CE_Cm_Cp + CE_Cm_[uVar7];
    iVar4 = NAdjP[uVar7];
    iVar8 = NAdjP[(ulong)(uint)v + 1];
    if (iVar4 < iVar8) {
      lVar9 = (long)iVar4;
      do {
        CE_Cp_[piVar3[lVar9]] = CE_Cp_[piVar3[lVar9]] + 1;
        lVar9 = lVar9 + 1;
      } while (iVar8 != lVar9);
    }
  }
  piVar5 = AdjB;
  iVar8 = v + 1;
  sizeC = sizeC + 1;
  CE_P_P = CE_P_P - iVar6;
  cnt_lP = cnt_lP + -1;
  lVar9 = (long)AdjP[uVar7];
  iVar6 = AdjP[iVar8];
  if (AdjP[uVar7] < iVar6) {
    do {
      iVar2 = piVar5[lVar9];
      neiC[iVar2] = neiC[iVar2] + 1;
      neiP[iVar2] = neiP[iVar2] + -1;
      lVar9 = lVar9 + 1;
    } while (iVar6 != lVar9);
  }
  iVar6 = NAdjP[iVar8];
  if (iVar4 < iVar6) {
    lVar10 = (long)iVar4;
    piVar5 = piVar3 + lVar10;
    lVar9 = lVar10 * 4;
    do {
      lVar9 = lVar9 + 4;
      iVar4 = *piVar5;
      uVar7 = (ulong)iVar4;
      iVar2 = CE_P_[uVar7];
      CE_P_[uVar7] = iVar2 + -1;
      if ((Cp.super__Base_bitset<235UL>._M_w[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        if ((Cm.super__Base_bitset<235UL>._M_w[uVar7 >> 6] & 1L << ((byte)iVar4 & 0x3f)) != 0) {
          CE_Cp_P = CE_Cp_P + -1;
        }
      }
      else {
        CE_Cp_P = CE_Cp_P + -1;
        if (iVar2 + -1 == 0) {
          add_from_Cp_to_Cm(iVar4);
          iVar6 = NAdjP[iVar8];
          piVar3 = NAdjB;
        }
      }
      lVar10 = lVar10 + 1;
      piVar5 = (int *)((long)piVar3 + lVar9);
    } while (lVar10 < iVar6);
  }
  return;
}

Assistant:

inline void add2C(int v) {
    P.reset(v); --sizeP;
    if (CE_P_[v] > 0) {Cp.set(v); in_Cp(v);}
    else {Cm.set(v); in_Cm(v);}
    ++sizeC;

    CE_P_P -= CE_P_[v];
    --cnt_lP;

    FOR_NA(v, u) {++neiC[u]; --neiP[u];}

    FOR_C_NA(v, u) {
        --CE_P_[u];
        if (Cp[u] || Cm[u]) --CE_Cp_P;
        if (CE_P_[u] == 0 && Cp[u])
            add_from_Cp_to_Cm(u);
    }
}